

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O1

void __thiscall OPN2::setPatch(OPN2 *this,size_t c,OpnTimbre *instrument)

{
  uint8_t *puVar1;
  pointer pOVar2;
  OPNChipBase *pOVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  OpnTimbre *pOVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  
  uVar15 = c / 6;
  uVar13 = c % 6;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar13;
  pOVar2 = (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)instrument->OPS;
  uVar7 = *(undefined8 *)(instrument->OPS[1].data + 1);
  uVar8 = *(undefined8 *)(instrument->OPS[3].data + 3);
  puVar1 = pOVar2[c].OPS[2].data + 2;
  *(undefined8 *)puVar1 = *(undefined8 *)(instrument->OPS[2].data + 2);
  *(undefined8 *)(puVar1 + 8) = uVar8;
  pOVar2 = pOVar2 + c;
  *(undefined8 *)pOVar2->OPS = uVar6;
  *(undefined8 *)(pOVar2->OPS[1].data + 1) = uVar7;
  uVar10 = (int)c + SUB164(auVar5 * ZEXT816(0x5555555555555556),8) * -3 + (int)uVar15 * -6 + 0x30;
  lVar9 = 0;
  pOVar12 = instrument;
  do {
    lVar14 = -0x1c;
    uVar11 = uVar10;
    do {
      pOVar3 = (this->m_chips).
               super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].m_p;
      (*pOVar3->_vptr_OPNChipBase[0xb])
                (pOVar3,(ulong)(2 < uVar13),(ulong)(uVar11 & 0xffff),
                 (ulong)*(uint8_t *)((long)(pOVar12->OPS + 4) + lVar14));
      uVar11 = (uVar11 & 0xffff) + 4;
      lVar14 = lVar14 + 7;
    } while (lVar14 != 0);
    lVar9 = lVar9 + 1;
    pOVar12 = (OpnTimbre *)(pOVar12->OPS[0].data + 1);
    uVar10 = uVar10 + 0x10;
  } while (lVar9 != 7);
  pOVar3 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar15].m_p;
  uVar10 = (uint)(uVar13 % 3);
  (*pOVar3->_vptr_OPNChipBase[0xb])
            (pOVar3,(ulong)(2 < uVar13),(ulong)(uVar10 | 0xb0),(ulong)instrument->fbalg);
  puVar4 = (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4[c] = instrument->lfosens & 0x3f | puVar4[c] & 0xc0;
  pOVar3 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar15].m_p;
  (*pOVar3->_vptr_OPNChipBase[0xb])
            (pOVar3,(ulong)(2 < uVar13),(ulong)(uVar10 | 0xb4),
             (ulong)(this->m_regLFOSens).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[c]);
  return;
}

Assistant:

void OPN2::setPatch(size_t c, const OpnTimbre &instrument)
{
    size_t      chip;
    uint8_t     port;
    uint32_t    cc;
    getOpnChannel(c, chip, port, cc);
    m_insCache[c] = instrument;
    for(uint8_t d = 0; d < 7; d++)
    {
        for(uint8_t op = 0; op < 4; op++)
            writeRegI(chip, port, 0x30 + (0x10 * d) + (op * 4) + cc, instrument.OPS[op].data[d]);
    }

    writeRegI(chip, port, 0xB0 + cc, instrument.fbalg);//Feedback/Algorithm
    m_regLFOSens[c] = (m_regLFOSens[c] & 0xC0) | (instrument.lfosens & 0x3F);
    writeRegI(chip, port, 0xB4 + cc, m_regLFOSens[c]);//Panorame and LFO bits
}